

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::parseFunctionParams(Parser *this,Function *f)

{
  Type TVar1;
  Module *pMVar2;
  size_t sVar3;
  Structure *o;
  bool bVar4;
  IntrinsicType IVar5;
  Variable *pVVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar7;
  string_view s;
  string intrin;
  CodeLocation paramLocation;
  Identifier name;
  FunctionParseState state;
  undefined1 local_d8 [8];
  soul *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  Role local_b4;
  undefined1 local_b0 [32];
  string local_90;
  Function *local_70;
  void *local_68;
  undefined8 uStack_60;
  long local_58;
  void *pvStack_50;
  undefined8 local_48;
  long lStack_40;
  undefined8 local_38;
  
  local_68 = (void *)0x0;
  uStack_60 = 0;
  local_58 = 0;
  pvStack_50 = (void *)0x0;
  local_48 = 0;
  lStack_40 = 0;
  local_38 = 0;
  local_70 = f;
  bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2acfd0);
  if (!bVar4) {
    do {
      readValueOrRefType((Type *)local_d8,this);
      local_b0._0_8_ =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.sourceCode.object;
      if ((SourceCodeText *)local_b0._0_8_ != (SourceCodeText *)0x0) {
        (((SourceCodeText *)local_b0._0_8_)->super_RefCountedObject).refCount =
             (((SourceCodeText *)local_b0._0_8_)->super_RefCountedObject).refCount + 1;
      }
      local_b0._8_8_ =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      local_90._M_dataplus._M_p = (pointer)parseVariableIdentifier(this);
      pMVar2 = (this->module).object;
      if (pMVar2 == (Module *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      local_b4 = parameter;
      pVVar6 = PoolAllocator::
               allocate<soul::heart::Variable,soul::CodeLocation,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                         (&pMVar2->allocator->pool,(CodeLocation *)local_b0,(Type *)local_d8,
                          (Identifier *)&local_90,&local_b4);
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::reserve
                (&f->parameters,(f->parameters).numActive + 1);
      sVar3 = (f->parameters).numActive;
      (f->parameters).items[sVar3].object = pVVar6;
      (f->parameters).numActive = sVar3 + 1;
      bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x289d49);
      if (!bVar4) {
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)0x2acfd0);
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_b0._0_8_);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_c8._M_allocated_capacity);
    } while (bVar4);
  }
  if ((f->functionType).type != event) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x289f31);
    readValueType((Type *)local_d8,this);
    (f->returnType).category = local_d8[0];
    (f->returnType).arrayElementCategory = local_d8[1];
    (f->returnType).isRef = (bool)local_d8[2];
    (f->returnType).isConstant = (bool)local_d8[3];
    (f->returnType).primitiveType.type = local_d8._4_4_;
    *(soul **)&(f->returnType).boundingSize = local_d0;
    o = (f->returnType).structure.object;
    if ((Structure *)local_c8._M_allocated_capacity != o) {
      (f->returnType).structure.object = (Structure *)local_c8._M_allocated_capacity;
      local_c8._M_allocated_capacity = 0;
      RefCountedPtr<soul::Structure>::decIfNotNull(o);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_c8._M_allocated_capacity);
  }
  parseAnnotation(this,&f->annotation);
  bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2881d4);
  if (!bVar4) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x289d4b);
  }
  local_b0._0_8_ = (SourceCodeText *)(local_b0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"intrin","");
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  Annotation::getString((string *)local_d8,&f->annotation,(string *)local_b0,&local_90);
  pcVar7 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._1_7_,local_90.field_2._M_local_buf[0]) + 1);
    pcVar7 = extraout_RDX_00;
  }
  if ((SourceCodeText *)local_b0._0_8_ != (SourceCodeText *)(local_b0 + 0x10)) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    pcVar7 = extraout_RDX_01;
  }
  if (local_d0 != (soul *)0x0) {
    s._M_len._4_4_ = local_d8._4_4_;
    s._M_len._0_4_ = local_d8._0_4_;
    s._M_str = pcVar7;
    IVar5 = getIntrinsicTypeFromName(local_d0,s);
    f->intrinsicType = IVar5;
    TVar1 = (f->functionType).type;
    if (TVar1 == normal) {
      (f->functionType).type = intrinsic;
    }
    else if (TVar1 != intrinsic) {
      throwInternalCompilerError("isNormal() || newType.isNormal()","operator=",0x34f);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != &local_c8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_d8._4_4_,local_d8._0_4_),
                    (ulong)(local_c8._M_allocated_capacity + 1));
  }
  if (pvStack_50 != (void *)0x0) {
    operator_delete(pvStack_50,lStack_40 - (long)pvStack_50);
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return;
}

Assistant:

void parseFunctionParams (heart::Function& f)
    {
        FunctionParseState state (f);

        if (! matchIf (HEARTOperator::closeParen))
        {
            for (;;)
            {
                auto type = readValueOrRefType();
                auto paramLocation = location;
                auto name = parseVariableIdentifier();
                f.parameters.push_back (module->allocate<heart::Variable> (std::move (paramLocation), type, name,
                                                                           heart::Variable::Role::parameter));

                if (matchIf (HEARTOperator::comma))
                    continue;

                expect (HEARTOperator::closeParen);
                break;
            }
        }

        if (! f.functionType.isEvent())
        {
            expect (HEARTOperator::rightArrow);
            f.returnType = readValueType();
        }

        parseAnnotation (f.annotation);

        if (! matchIf (HEARTOperator::semicolon))
            expect (HEARTOperator::openBrace);

        auto intrin = f.annotation.getString ("intrin");

        if (! intrin.empty())
        {
            f.intrinsicType = getIntrinsicTypeFromName (intrin);
            f.functionType = heart::FunctionType::intrinsic();
        }
    }